

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<capnp::AnyPointer::Pipeline>::~ExceptionOr
          (ExceptionOr<capnp::AnyPointer::Pipeline> *this)

{
  ExceptionOr<capnp::AnyPointer::Pipeline> *this_local;
  
  Maybe<capnp::AnyPointer::Pipeline>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr() = default;